

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

application * __thiscall
cppcms::application_specific_pool::get_new(application_specific_pool *this,service *srv)

{
  _Atomic_word *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  weak_ptr<cppcms::application_specific_pool> local_38;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  application *this_00;
  
  iVar2 = (*this->_vptr_application_specific_pool[2])();
  this_00 = (application *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (application *)0x0) {
    std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::application_specific_pool,void>
              ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)
               &local_28,
               (__weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppcms::application_specific_pool>);
    local_38.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_28;
    local_38.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_20;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_weak_count = local_20->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_weak_count = local_20->_M_weak_count + 1;
      }
    }
    application::set_pool(this_00,&local_38);
    if (local_38.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_38.
                   super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar2 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar2 = (local_38.
                 super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_38.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
      }
      if (iVar2 == 1) {
        (*(local_38.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  return this_00;
}

Assistant:

application *application_specific_pool::get_new(service &srv)
{
	application *a = new_application(srv);
	if(!a)
		return 0;
	a->set_pool(shared_from_this());
	return a;
}